

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O3

int __thiscall
QCommandLinkButtonPrivate::descriptionHeight(QCommandLinkButtonPrivate *this,int widgetWidth)

{
  int iVar1;
  undefined4 uVar2;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  long in_FS_OFFSET;
  double dVar3;
  QTextLayout layout;
  double local_70;
  QTextLayout local_50;
  undefined1 local_48 [8];
  qreal qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = textOffset(this);
  if ((this->description).d.size == 0) {
    local_70 = 0.0;
  }
  else {
    local_50.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::QTextLayout(&local_50,(QString *)&this->description);
    descriptionFont((QCommandLinkButtonPrivate *)local_48);
    QTextLayout::setFont((QFont *)&local_50);
    QFont::~QFont((QFont *)local_48);
    QTextLayout::beginLayout();
    local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uVar2 = QTextLayout::createLine();
    local_48._0_4_ = uVar2;
    if (extraout_RDX == 0.0) {
      local_70 = 0.0;
    }
    else {
      local_70 = 0.0;
      qStack_40 = extraout_RDX;
      do {
        QTextLine::setLineWidth((double)((widgetWidth - iVar1) + -4));
        QTextLine::setPosition((QPointF *)local_48);
        dVar3 = (double)QTextLine::height();
        local_70 = local_70 + dVar3;
        local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        qStack_40 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        uVar2 = QTextLayout::createLine();
        local_48._0_4_ = uVar2;
        qStack_40 = extraout_RDX_00;
      } while (extraout_RDX_00 != 0.0);
    }
    qStack_40 = 0.0;
    QTextLayout::endLayout();
    QTextLayout::~QTextLayout(&local_50);
  }
  dVar3 = ceil(local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)dVar3;
}

Assistant:

int QCommandLinkButtonPrivate::descriptionHeight(int widgetWidth) const
{
    // Calc width of actual paragraph
    int lineWidth = widgetWidth - textOffset() - rightMargin();

    qreal descriptionheight = 0;
    if (!description.isEmpty()) {
        QTextLayout layout(description);
        layout.setFont(descriptionFont());
        layout.beginLayout();
        while (true) {
            QTextLine line = layout.createLine();
            if (!line.isValid())
                break;
            line.setLineWidth(lineWidth);
            line.setPosition(QPointF(0, descriptionheight));
            descriptionheight += line.height();
        }
        layout.endLayout();
    }
    return qCeil(descriptionheight);
}